

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O0

void fio_uuid_link(intptr_t uuid,void *obj,_func_void_void_ptr *on_close)

{
  uint uVar1;
  int *piVar2;
  _func_void_void_ptr *on_close_local;
  void *obj_local;
  intptr_t uuid_local;
  
  if (((-1 < uuid) && (uVar1 = (uint)((ulong)uuid >> 8), uVar1 < fio_data->capa)) &&
     ((uuid & 0xffU) == (ulong)*(byte *)((long)fio_data + (long)(int)uVar1 * 0xa8 + 0x6d))) {
    fio_lock((fio_lock_i *)((long)fio_data + (long)(int)uVar1 * 0xa8 + 0x6e));
    if (((-1 < uuid) && (uVar1 < fio_data->capa)) &&
       ((uuid & 0xffU) == (ulong)*(byte *)((long)fio_data + (long)(int)uVar1 * 0xa8 + 0x6d))) {
      fio_uuid_links_overwrite
                ((fio_uuid_links_s *)((long)fio_data + (long)(int)uVar1 * 0xa8 + 0xb8),
                 (uintptr_t)obj,on_close,(fio_uuid_link_fn *)0x0);
      fio_unlock((fio_lock_i *)((long)fio_data + (long)(int)uVar1 * 0xa8 + 0x6e));
      return;
    }
    fio_unlock((fio_lock_i *)((long)fio_data + (long)(int)uVar1 * 0xa8 + 0x6e));
  }
  piVar2 = __errno_location();
  *piVar2 = 9;
  (*on_close)(obj);
  return;
}

Assistant:

void fio_uuid_link(intptr_t uuid, void *obj, void (*on_close)(void *obj)) {
  if (!uuid_is_valid(uuid))
    goto invalid;
  fio_lock(&uuid_data(uuid).sock_lock);
  if (!uuid_is_valid(uuid))
    goto locked_invalid;
  fio_uuid_links_overwrite(&uuid_data(uuid).links, (uintptr_t)obj, on_close,
                           NULL);
  fio_unlock(&uuid_data(uuid).sock_lock);
  return;
locked_invalid:
  fio_unlock(&uuid_data(uuid).sock_lock);
invalid:
  errno = EBADF;
  on_close(obj);
}